

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost_omac_ctrl(EVP_PKEY_CTX *ctx,int type,int p1,void *p2,size_t max_size)

{
  int iVar1;
  short *psVar2;
  EVP_PKEY *pkey_00;
  void *pvVar3;
  EVP_MD *pEVar4;
  code *pcVar5;
  EVP_MD_CTX *in_RCX;
  int in_EDX;
  int in_ESI;
  EVP_PKEY_CTX *in_RDI;
  ulong in_R8;
  EVP_PKEY *pkey;
  gost_mac_key *key;
  EVP_MD_CTX *mctx;
  int nid;
  gost_mac_pmeth_data *data;
  undefined4 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  int local_4;
  
  psVar2 = (short *)EVP_PKEY_CTX_get_data(in_RDI);
  if (in_ESI == 1) {
    iVar1 = EVP_MD_get_type(in_RCX);
    if ((((iVar1 == 0x4a8) || (iVar1 == 0x3f9)) || (iVar1 == 0x49a)) || (iVar1 == 0x497)) {
      *(EVP_MD_CTX **)(psVar2 + 4) = in_RCX;
      local_4 = 1;
    }
    else {
      ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0,
                     (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8),0);
      local_4 = 0;
    }
  }
  else if (in_ESI - 3U < 3) {
    local_4 = 1;
  }
  else {
    iVar1 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    if (in_ESI == 6) {
      if (in_EDX == 0x20) {
        *(EVP_MD **)(psVar2 + 8) = in_RCX->digest;
        *(ENGINE **)(psVar2 + 0xc) = in_RCX->engine;
        *(ulong *)(psVar2 + 0x10) = in_RCX->flags;
        *(void **)(psVar2 + 0x14) = in_RCX->md_data;
        *psVar2 = 1;
        local_4 = 1;
      }
      else {
        ERR_GOST_error(iVar1,(int)in_stack_ffffffffffffffb0,
                       (char *)CONCAT44(6,in_stack_ffffffffffffffa8),0);
        local_4 = 0;
      }
    }
    else if (in_ESI == 7) {
      if (*psVar2 == 0) {
        pkey_00 = EVP_PKEY_CTX_get0_pkey(in_RDI);
        if (pkey_00 == (EVP_PKEY *)0x0) {
          ERR_GOST_error(0,0,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8),0);
          local_4 = 0;
        }
        else {
          pvVar3 = EVP_PKEY_get0(pkey_00);
          if (pvVar3 == (void *)0x0) {
            ERR_GOST_error((int)((ulong)pkey_00 >> 0x20),(int)pkey_00,
                           (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8),0);
            local_4 = 0;
          }
          else {
            pEVar4 = EVP_MD_CTX_md(in_RCX);
            pcVar5 = (code *)EVP_MD_meth_get_ctrl(pEVar4);
            local_4 = (*pcVar5)(in_RCX,0x1004,0,pvVar3);
          }
        }
      }
      else {
        pEVar4 = EVP_MD_CTX_md(in_RCX);
        pcVar5 = (code *)EVP_MD_meth_get_ctrl(pEVar4);
        local_4 = (*pcVar5)(in_RCX,0x1004,0x20,psVar2 + 8);
      }
    }
    else if (in_ESI == 0xd) {
      in_RCX->digest = *(EVP_MD **)(psVar2 + 4);
      local_4 = 1;
    }
    else if (in_ESI == 0x1005) {
      if ((in_EDX < 1) || (in_R8 < (ulong)(long)in_EDX)) {
        ERR_GOST_error(iVar1,(int)in_stack_ffffffffffffffb0,
                       (char *)CONCAT44(0x1005,in_stack_ffffffffffffffa8),0);
        local_4 = 0;
      }
      else {
        psVar2[1] = (short)in_EDX;
        local_4 = 1;
      }
    }
    else {
      local_4 = -2;
    }
  }
  return local_4;
}

Assistant:

static int pkey_gost_omac_ctrl(EVP_PKEY_CTX *ctx, int type, int p1, void *p2, size_t max_size)
{
    struct gost_mac_pmeth_data *data =
        (struct gost_mac_pmeth_data *)EVP_PKEY_CTX_get_data(ctx);

    switch (type) {
    case EVP_PKEY_CTRL_MD:
        {
            int nid = EVP_MD_type((const EVP_MD *)p2);
            if (nid != NID_magma_mac && nid != NID_grasshopper_mac
                && nid != NID_id_tc26_cipher_gostr3412_2015_kuznyechik_ctracpkm_omac /* FIXME beldmit */
                && nid != NID_id_tc26_cipher_gostr3412_2015_magma_ctracpkm_omac) {
                GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL,
                        GOST_R_INVALID_DIGEST_TYPE);
                return 0;
            }
            data->md = (EVP_MD *)p2;
            return 1;
        }

    case EVP_PKEY_CTRL_GET_MD:
        *(const EVP_MD **)p2 = data->md;
        return 1;

    case EVP_PKEY_CTRL_PKCS7_ENCRYPT:
    case EVP_PKEY_CTRL_PKCS7_DECRYPT:
    case EVP_PKEY_CTRL_PKCS7_SIGN:
        return 1;
    case EVP_PKEY_CTRL_SET_MAC_KEY:
        if (p1 != 32) {
            GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL, GOST_R_INVALID_MAC_KEY_LENGTH);
            return 0;
        }

        memcpy(data->key, p2, 32);
        data->key_set = 1;
        return 1;
    case EVP_PKEY_CTRL_DIGESTINIT:
        {
            EVP_MD_CTX *mctx = p2;
            if (!data->key_set) {
                struct gost_mac_key *key;
                EVP_PKEY *pkey = EVP_PKEY_CTX_get0_pkey(ctx);
                if (!pkey) {
                    GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL,
                            GOST_R_MAC_KEY_NOT_SET);
                    return 0;
                }
                key = EVP_PKEY_get0(pkey);
                if (!key) {
                    GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL,
                            GOST_R_MAC_KEY_NOT_SET);
                    return 0;
                }
                return EVP_MD_meth_get_ctrl(EVP_MD_CTX_md(mctx))
                    (mctx, EVP_MD_CTRL_SET_KEY, 0, key);
            } else {
                return EVP_MD_meth_get_ctrl(EVP_MD_CTX_md(mctx))
                    (mctx, EVP_MD_CTRL_SET_KEY, 32, &(data->key));
            }
        }
    case EVP_PKEY_CTRL_MAC_LEN:
        {
            if (p1 < 1 || p1 > max_size) {

                GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL, GOST_R_INVALID_MAC_SIZE);
                return 0;
            }
            data->mac_size = p1;
            return 1;
        }
    }
    return -2;
}